

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O0

void __thiscall
ruckig::BrakeProfile::get_second_order_position_brake_trajectory
          (BrakeProfile *this,double v0,double vMax,double vMin,double aMax,double aMin)

{
  reference pvVar1;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  double v0_local;
  BrakeProfile *this_local;
  
  pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->t,1);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->j,0);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->j,1);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->a,0);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->a,1);
  *pvVar1 = 0.0;
  if (((aMax != 0.0) || (NAN(aMax))) && ((aMin != 0.0 || (NAN(aMin))))) {
    if (v0 <= vMax) {
      if (v0 < vMin) {
        pvVar1 = std::array<double,_2UL>::operator[](&this->a,0);
        *pvVar1 = aMax;
        pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
        *pvVar1 = (vMin - v0) / aMax + 2.2e-14;
      }
    }
    else {
      pvVar1 = std::array<double,_2UL>::operator[](&this->a,0);
      *pvVar1 = aMin;
      pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
      *pvVar1 = (vMax - v0) / aMin + 2.2e-14;
    }
  }
  return;
}

Assistant:

void BrakeProfile::get_second_order_position_brake_trajectory(double v0, double vMax, double vMin, double aMax, double aMin) {
    t[0] = 0.0;
    t[1] = 0.0;
    j[0] = 0.0;
    j[1] = 0.0;
    a[0] = 0.0;
    a[1] = 0.0;

    if (aMax == 0.0 || aMin == 0.0) {
        return; // Ignore braking for zero-limits
    }

    if (v0 > vMax) {
        a[0] = aMin;
        t[0] = (vMax - v0)/aMin + eps;

    } else if (v0 < vMin) {
        a[0] = aMax;
        t[0] = (vMin - v0)/aMax + eps;
    }
}